

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

int do_cmake(int ac,char **av)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  cmState *pcVar9;
  reference pbVar10;
  char *pcVar11;
  bool in_DL;
  allocator local_ba9;
  string local_ba8;
  allocator local_b81;
  string local_b80;
  char *local_b60;
  char *advancedProp;
  iterator iStack_b50;
  CacheEntryType t;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b40;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  int res;
  allocator local_af1;
  string local_af0;
  undefined1 local_ad0 [8];
  cmake cm;
  int ret;
  allocator local_7f1;
  string local_7f0;
  undefined1 local_7d0 [8];
  cmake cm_1;
  value_type local_518;
  allocator local_4f1;
  value_type local_4f0;
  allocator local_4c9;
  value_type local_4c8;
  allocator local_4a1;
  value_type local_4a0;
  int local_47c;
  undefined1 local_478 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  bool local_455;
  WorkingMode workingMode;
  bool view_only;
  bool list_help;
  bool list_all_cached;
  bool list_cached;
  bool sysinfo;
  string local_448;
  undefined1 local_428 [8];
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  undefined1 local_408 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  undefined1 local_3a0 [8];
  cmake hcm;
  undefined1 local_e0 [8];
  cmDocumentation doc;
  char **av_local;
  int ac_local;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&doc.Formatter.TextIndent,(SystemTools *)0x1,in_DL);
  bVar4 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&doc.Formatter.TextIndent);
  if ((bVar4 & 1) == 0) {
    cmDocumentation::cmDocumentation((cmDocumentation *)local_e0);
    cmDocumentation::addCMakeStandardDocSections((cmDocumentation *)local_e0);
    bVar5 = cmDocumentation::CheckOptions((cmDocumentation *)local_e0,ac,av,(char *)0x0);
    if (bVar5) {
      cmake::cmake((cmake *)local_3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c0,"",&local_3c1);
      cmake::SetHomeDirectory((cmake *)local_3a0,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3e8,"",
                 (allocator *)
                 ((long)&args_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmake::SetHomeOutputDirectory((cmake *)local_3a0,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&args_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmake::AddCMakePaths((cmake *)local_3a0);
      this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&generators.
                        super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(this);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const*const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_408,av,
                 av + ac,this);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&generators.
                            super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmake::SetCacheArgs((cmake *)local_3a0,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_408);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::vector
                ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_428);
      cmake::GetGeneratorDocumentation
                ((cmake *)local_3a0,
                 (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_428);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_448,"cmake",(allocator *)&sysinfo);
      cmDocumentation::SetName((cmDocumentation *)local_e0,&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::allocator<char>::~allocator((allocator<char> *)&sysinfo);
      cmDocumentation::SetSection((cmDocumentation *)local_e0,"Name",cmDocumentationName);
      cmDocumentation::SetSection((cmDocumentation *)local_e0,"Usage",cmDocumentationUsage);
      if (ac == 1) {
        cmDocumentation::AppendSection((cmDocumentation *)local_e0,"Usage",cmDocumentationUsageNote)
        ;
      }
      cmDocumentation::AppendSection
                ((cmDocumentation *)local_e0,"Generators",
                 (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_428);
      cmDocumentation::PrependSection((cmDocumentation *)local_e0,"Options",cmDocumentationOptions);
      bVar5 = cmDocumentation::PrintRequestedDocumentation
                        ((cmDocumentation *)local_e0,(ostream *)&std::cout);
      av_local._4_4_ = (uint)!bVar5;
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
                ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_428);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_408);
      cmake::~cmake((cmake *)local_3a0);
    }
    else {
      bVar5 = false;
      bVar1 = false;
      bVar2 = false;
      bVar3 = false;
      local_455 = false;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = NORMAL_MODE;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_478);
      for (local_47c = 0; local_47c < ac; local_47c = local_47c + 1) {
        iVar7 = strcmp(av[local_47c],"-i");
        if (iVar7 == 0) {
          std::operator<<((ostream *)&std::cerr,
                          "The \"cmake -i\" wizard mode is no longer supported.\nUse the -D option to set cache values on the command line.\nUse cmake-gui or ccmake for an interactive dialog.\n"
                         );
          av_local._4_4_ = 1;
          goto LAB_0042fdb0;
        }
        iVar7 = strcmp(av[local_47c],"--system-information");
        if (iVar7 == 0) {
          bVar5 = true;
        }
        else {
          iVar7 = strcmp(av[local_47c],"-N");
          if (iVar7 == 0) {
            local_455 = true;
          }
          else {
            iVar7 = strcmp(av[local_47c],"-L");
            if (iVar7 == 0) {
              bVar1 = true;
            }
            else {
              iVar7 = strcmp(av[local_47c],"-LA");
              if (iVar7 == 0) {
                bVar2 = true;
              }
              else {
                iVar7 = strcmp(av[local_47c],"-LH");
                if (iVar7 == 0) {
                  bVar1 = true;
                  bVar3 = true;
                }
                else {
                  iVar7 = strcmp(av[local_47c],"-LAH");
                  if (iVar7 == 0) {
                    bVar2 = true;
                    bVar3 = true;
                  }
                  else {
                    bVar6 = cmHasLiteralPrefix<char_const*,3ul>
                                      (av + local_47c,(char (*) [3])0x8ee147);
                    if (bVar6) {
                      if (local_47c == ac + -1) {
                        cmSystemTools::Error
                                  ("No script specified for argument -P",(char *)0x0,(char *)0x0,
                                   (char *)0x0);
                      }
                      else {
                        args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = SCRIPT_MODE;
                        pcVar11 = av[local_47c];
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_4a0,pcVar11,&local_4a1);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_478,&local_4a0);
                        std::__cxx11::string::~string((string *)&local_4a0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
                        local_47c = local_47c + 1;
                        pcVar11 = av[local_47c];
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_4c8,pcVar11,&local_4c9);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_478,&local_4c8);
                        std::__cxx11::string::~string((string *)&local_4c8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
                      }
                    }
                    else {
                      bVar6 = cmHasLiteralPrefix<char_const*,15ul>
                                        (av + local_47c,(char (*) [15])"--find-package");
                      if (bVar6) {
                        args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = FIND_PACKAGE_MODE
                        ;
                        pcVar11 = av[local_47c];
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_4f0,pcVar11,&local_4f1);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_478,&local_4f0);
                        std::__cxx11::string::~string((string *)&local_4f0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
                      }
                      else {
                        pcVar11 = av[local_47c];
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_518,pcVar11,
                                   (allocator *)((long)&cm_1.CurrentSnapshot.Position.Position + 7))
                        ;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_478,&local_518);
                        std::__cxx11::string::~string((string *)&local_518);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)
                                   ((long)&cm_1.CurrentSnapshot.Position.Position + 7));
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (bVar5) {
        cmake::cmake((cmake *)local_7d0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_7f0,"",&local_7f1);
        cmake::SetHomeDirectory((cmake *)local_7d0,&local_7f0);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&ret,"",(allocator *)((long)&cm.CurrentSnapshot.Position.Position + 7))
        ;
        cmake::SetHomeOutputDirectory((cmake *)local_7d0,(string *)&ret);
        std::__cxx11::string::~string((string *)&ret);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&cm.CurrentSnapshot.Position.Position + 7));
        av_local._4_4_ =
             cmake::GetSystemInformation
                       ((cmake *)local_7d0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_478);
        cm.CurrentSnapshot.Position.Position._0_4_ = av_local._4_4_;
        cmake::~cmake((cmake *)local_7d0);
      }
      else {
        cmake::cmake((cmake *)local_ad0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_af0,"",&local_af1);
        cmake::SetHomeDirectory((cmake *)local_ad0,&local_af0);
        std::__cxx11::string::~string((string *)&local_af0);
        std::allocator<char>::~allocator((allocator<char> *)&local_af1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&res,"",
                   (allocator *)
                   ((long)&keys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmake::SetHomeOutputDirectory((cmake *)local_ad0,(string *)&res);
        std::__cxx11::string::~string((string *)&res);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&keys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmSystemTools::SetMessageCallback(cmakemainMessageCallback,local_ad0);
        cmake::SetProgressCallback((cmake *)local_ad0,cmakemainProgressCallback,(cmake *)local_ad0);
        cmake::SetWorkingMode
                  ((cmake *)local_ad0,
                   args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             cmake::Run((cmake *)local_ad0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_478,local_455);
        if ((bVar1) || (bVar2)) {
          poVar8 = std::operator<<((ostream *)&std::cout,"-- Cache values");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          pcVar9 = cmake::GetState((cmake *)local_ad0);
          cmState::GetCacheEntryKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&it,pcVar9);
          local_b48._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&it);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_b40,&local_b48);
          while( true ) {
            iStack_b50 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&it);
            bVar5 = __gnu_cxx::operator!=(&local_b40,&stack0xfffffffffffff4b0);
            if (!bVar5) break;
            pcVar9 = cmake::GetState((cmake *)local_ad0);
            pbVar10 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_b40);
            advancedProp._4_4_ = cmState::GetCacheEntryType(pcVar9,pbVar10);
            if (((advancedProp._4_4_ != INTERNAL) && (advancedProp._4_4_ != STATIC)) &&
               (advancedProp._4_4_ != UNINITIALIZED)) {
              pcVar9 = cmake::GetState((cmake *)local_ad0);
              pbVar10 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_b40);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_b80,"ADVANCED",&local_b81);
              pcVar11 = cmState::GetCacheEntryProperty(pcVar9,pbVar10,&local_b80);
              std::__cxx11::string::~string((string *)&local_b80);
              std::allocator<char>::~allocator((allocator<char> *)&local_b81);
              local_b60 = pcVar11;
              if ((bVar2) || (pcVar11 == (char *)0x0)) {
                if (bVar3) {
                  poVar8 = std::operator<<((ostream *)&std::cout,"// ");
                  pcVar9 = cmake::GetState((cmake *)local_ad0);
                  pbVar10 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_b40);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_ba8,"HELPSTRING",&local_ba9);
                  pcVar11 = cmState::GetCacheEntryProperty(pcVar9,pbVar10,&local_ba8);
                  poVar8 = std::operator<<(poVar8,pcVar11);
                  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                  std::__cxx11::string::~string((string *)&local_ba8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
                }
                pbVar10 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_b40);
                poVar8 = std::operator<<((ostream *)&std::cout,(string *)pbVar10);
                poVar8 = std::operator<<(poVar8,":");
                pcVar11 = cmState::CacheEntryTypeToString(advancedProp._4_4_);
                poVar8 = std::operator<<(poVar8,pcVar11);
                poVar8 = std::operator<<(poVar8,"=");
                pcVar9 = cmake::GetState((cmake *)local_ad0);
                pbVar10 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_b40);
                pcVar11 = cmState::GetCacheEntryValue(pcVar9,pbVar10);
                poVar8 = std::operator<<(poVar8,pcVar11);
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                if (bVar3) {
                  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_b40);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&it);
        }
        av_local._4_4_ =
             (uint)((int)keys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage != 0);
        cmake::~cmake((cmake *)local_ad0);
      }
LAB_0042fdb0:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_478);
    }
    cmDocumentation::~cmDocumentation((cmDocumentation *)local_e0);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "Current working directory cannot be established.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    av_local._4_4_ = 1;
  }
  return av_local._4_4_;
}

Assistant:

int do_cmake(int ac, char const* const* av)
{
  if (cmSystemTools::GetCurrentWorkingDirectory().empty())
    {
    std::cerr << "Current working directory cannot be established."
              << std::endl;
    return 1;
    }

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if(doc.CheckOptions(ac, av))
    {
    // Construct and print requested documentation.
    cmake hcm;
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();

    // the command line args are processed here so that you can do
    // -DCMAKE_MODULE_PATH=/some/path and have this value accessible here
    std::vector<std::string> args(av, av + ac);
    hcm.SetCacheArgs(args);

    std::vector<cmDocumentationEntry> generators;

    hcm.GetGeneratorDocumentation(generators);

    doc.SetName("cmake");
    doc.SetSection("Name",cmDocumentationName);
    doc.SetSection("Usage",cmDocumentationUsage);
    if ( ac == 1 )
      {
      doc.AppendSection("Usage",cmDocumentationUsageNote);
      }
    doc.AppendSection("Generators",generators);
    doc.PrependSection("Options",cmDocumentationOptions);

    return doc.PrintRequestedDocumentation(std::cout)? 0:1;
    }
#else
  if ( ac == 1 )
    {
    std::cout <<
      "Bootstrap CMake should not be used outside CMake build process."
              << std::endl;
    return 0;
    }
#endif

  bool sysinfo = false;
  bool list_cached = false;
  bool list_all_cached = false;
  bool list_help = false;
  bool view_only = false;
  cmake::WorkingMode workingMode = cmake::NORMAL_MODE;
  std::vector<std::string> args;
  for(int i =0; i < ac; ++i)
    {
    if(strcmp(av[i], "-i") == 0)
      {
      std::cerr <<
        "The \"cmake -i\" wizard mode is no longer supported.\n"
        "Use the -D option to set cache values on the command line.\n"
        "Use cmake-gui or ccmake for an interactive dialog.\n";
      return 1;
      }
    else if(strcmp(av[i], "--system-information") == 0)
      {
      sysinfo = true;
      }
    else if (strcmp(av[i], "-N") == 0)
      {
      view_only = true;
      }
    else if (strcmp(av[i], "-L") == 0)
      {
      list_cached = true;
      }
    else if (strcmp(av[i], "-LA") == 0)
      {
      list_all_cached = true;
      }
    else if (strcmp(av[i], "-LH") == 0)
      {
      list_cached = true;
      list_help = true;
      }
    else if (strcmp(av[i], "-LAH") == 0)
      {
      list_all_cached = true;
      list_help = true;
      }
    else if (cmHasLiteralPrefix(av[i], "-P"))
      {
      if ( i == ac -1 )
        {
        cmSystemTools::Error("No script specified for argument -P");
        }
      else
        {
        workingMode = cmake::SCRIPT_MODE;
        args.push_back(av[i]);
        i++;
        args.push_back(av[i]);
        }
      }
    else if (cmHasLiteralPrefix(av[i], "--find-package"))
      {
      workingMode = cmake::FIND_PACKAGE_MODE;
      args.push_back(av[i]);
      }
    else
      {
      args.push_back(av[i]);
      }
    }
  if (sysinfo)
    {
    cmake cm;
    cm.SetHomeDirectory("");
    cm.SetHomeOutputDirectory("");
    int ret = cm.GetSystemInformation(args);
    return ret;
    }
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmSystemTools::SetMessageCallback(cmakemainMessageCallback, (void *)&cm);
  cm.SetProgressCallback(cmakemainProgressCallback, (void *)&cm);
  cm.SetWorkingMode(workingMode);

  int res = cm.Run(args, view_only);
  if ( list_cached || list_all_cached )
    {
    std::cout << "-- Cache values" << std::endl;
    std::vector<std::string> keys = cm.GetState()->GetCacheEntryKeys();
    for (std::vector<std::string>::const_iterator it = keys.begin();
        it != keys.end(); ++it)
      {
      cmState::CacheEntryType t = cm.GetState()->GetCacheEntryType(*it);
      if (t != cmState::INTERNAL && t != cmState::STATIC &&
          t != cmState::UNINITIALIZED)
        {
        const char* advancedProp =
            cm.GetState()->GetCacheEntryProperty(*it, "ADVANCED");
        if ( list_all_cached || !advancedProp)
          {
          if ( list_help )
            {
            std::cout << "// "
                      << cm.GetState()->GetCacheEntryProperty(*it,
                                                   "HELPSTRING") << std::endl;
            }
          std::cout << *it << ":" <<
            cmState::CacheEntryTypeToString(t)
            << "=" << cm.GetState()->GetCacheEntryValue(*it)
            << std::endl;
          if ( list_help )
            {
            std::cout << std::endl;
            }
          }
        }
      }
    }

  // Always return a non-negative value.  Windows tools do not always
  // interpret negative return values as errors.
  if(res != 0)
    {
    return 1;
    }
  else
    {
    return 0;
    }
}